

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O2

Regexp * __thiscall
re2::Regexp::Walker<re2::Regexp_*>::WalkInternal
          (Walker<re2::Regexp_*> *this,Regexp *re,Regexp *top_arg,bool use_copy)

{
  ushort uVar1;
  stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
  *psVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_type sVar6;
  _Elt_pointer pWVar7;
  Regexp **ppRVar8;
  Regexp *pRVar9;
  ulong uVar10;
  bool stop;
  undefined1 local_1b0 [40];
  Regexp **local_188;
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/walker-inl.h",
               0xa0);
    std::operator<<((ostream *)(local_1b0 + 8),"Walk NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  else {
    local_1b0._8_4_ = -1;
    local_188 = (Regexp **)0x0;
    local_1b0._0_8_ = re;
    local_1b0._16_8_ = top_arg;
    std::deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>>::
    emplace_back<re2::WalkState<re2::Regexp*>>
              ((deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>> *)
               this->stack_,(WalkState<re2::Regexp_*> *)local_1b0);
LAB_00144b3b:
    while( true ) {
      psVar2 = this->stack_;
      pWVar7 = (psVar2->c).
               super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar7 == (psVar2->c).
                    super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar7 = (psVar2->c).
                 super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      pRVar9 = pWVar7[-1].re;
      uVar10 = (ulong)(uint)pWVar7[-1].n;
      if (pWVar7[-1].n == 0xffffffff) break;
LAB_00144b62:
      uVar1 = pRVar9->nsub_;
      if (uVar1 == 0) {
LAB_00144c34:
        iVar4 = (*this->_vptr_Walker[3])
                          (this,pRVar9,pWVar7[-1].parent_arg,pWVar7[-1].pre_arg,
                           pWVar7[-1].child_args);
        top_arg = (Regexp *)CONCAT44(extraout_var_01,iVar4);
        if ((1 < pRVar9->nsub_) && (pWVar7[-1].child_args != (Regexp **)0x0)) {
          operator_delete__(pWVar7[-1].child_args);
        }
        goto LAB_00144c7f;
      }
      if (uVar1 == 1) {
        paVar5 = &pRVar9->field_5;
      }
      else {
        paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar9->field_5).submany_;
      }
      iVar4 = (int)uVar10;
      if ((int)(uint)uVar1 <= iVar4) goto LAB_00144c34;
      if (use_copy && 0 < iVar4) {
        pRVar9 = (Regexp *)paVar5[uVar10].submany_;
        if ((Regexp *)paVar5[iVar4 - 1U].submany_ != pRVar9) goto LAB_00144cde;
        iVar3 = (*this->_vptr_Walker[4])(this,pWVar7[-1].child_args[iVar4 - 1U]);
        iVar4 = pWVar7[-1].n;
        pWVar7[-1].child_args[iVar4] = (Regexp *)CONCAT44(extraout_var_00,iVar3);
        pWVar7[-1].n = iVar4 + 1;
      }
      else {
        pRVar9 = (Regexp *)paVar5[iVar4].submany_;
LAB_00144cde:
        local_1b0._16_8_ = pWVar7[-1].pre_arg;
        local_1b0._8_4_ = -1;
        local_188 = (Regexp **)0x0;
        local_1b0._0_8_ = pRVar9;
        std::deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>>::
        emplace_back<re2::WalkState<re2::Regexp*>>
                  ((deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>>
                    *)this->stack_,(WalkState<re2::Regexp_*> *)local_1b0);
      }
    }
    iVar4 = this->max_visits_;
    this->max_visits_ = iVar4 + -1;
    if (iVar4 < 1) {
      this->stopped_early_ = true;
      iVar4 = (*this->_vptr_Walker[5])(this,pRVar9,pWVar7[-1].parent_arg);
      top_arg = (Regexp *)CONCAT44(extraout_var_02,iVar4);
    }
    else {
      local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
      iVar4 = (*this->_vptr_Walker[2])
                        (this,pRVar9,pWVar7[-1].parent_arg,(WalkState<re2::Regexp_*> *)local_1b0);
      top_arg = (Regexp *)CONCAT44(extraout_var,iVar4);
      pWVar7[-1].pre_arg = top_arg;
      if (local_1b0[0] == '\0') {
        pWVar7[-1].n = 0;
        pWVar7[-1].child_args = (Regexp **)0x0;
        uVar1 = pRVar9->nsub_;
        uVar10 = (ulong)uVar1;
        if (uVar1 != 0) {
          if (uVar1 == 1) {
            pWVar7[-1].child_args = &pWVar7[-1].child_arg;
            uVar10 = 0;
          }
          else {
            ppRVar8 = (Regexp **)operator_new__((ulong)uVar1 << 3);
            pWVar7[-1].child_args = ppRVar8;
            uVar10 = (ulong)(uint)pWVar7[-1].n;
          }
        }
        goto LAB_00144b62;
      }
    }
LAB_00144c7f:
    std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>::
    pop_back(&this->stack_->c);
    sVar6 = std::
            deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>::
            size(&this->stack_->c);
    if (sVar6 != 0) {
      psVar2 = this->stack_;
      pWVar7 = (psVar2->c).
               super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar7 == (psVar2->c).
                    super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar7 = (psVar2->c).
                 super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      if (pWVar7[-1].child_args == (Regexp **)0x0) {
        pWVar7[-1].child_arg = top_arg;
        iVar4 = pWVar7[-1].n;
      }
      else {
        iVar4 = pWVar7[-1].n;
        pWVar7[-1].child_args[iVar4] = top_arg;
      }
      pWVar7[-1].n = iVar4 + 1;
      goto LAB_00144b3b;
    }
  }
  return top_arg;
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        // Fall through.
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}